

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O2

void idct32_stage9_avx2(__m256i *bf1,__m256i *out,int do_cols,int bd,int out_shift,__m256i *clamp_lo
                       ,__m256i *clamp_hi)

{
  undefined1 auVar1 [32];
  __m256i alVar2;
  __m256i alVar3;
  undefined1 auVar4 [32];
  int iVar5;
  __m256i clamp_lo_out;
  int local_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x1f],(undefined1  [32])*bf1);
  auVar4 = vpsubd_avx2((undefined1  [32])*bf1,(undefined1  [32])bf1[0x1f]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  *out = alVar2;
  out[0x1f] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x1e],(undefined1  [32])bf1[1]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[1],(undefined1  [32])bf1[0x1e]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[1] = alVar2;
  out[0x1e] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x1d],(undefined1  [32])bf1[2]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[2],(undefined1  [32])bf1[0x1d]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[2] = alVar2;
  out[0x1d] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x1c],(undefined1  [32])bf1[3]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[3],(undefined1  [32])bf1[0x1c]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[3] = alVar2;
  out[0x1c] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x1b],(undefined1  [32])bf1[4]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[4],(undefined1  [32])bf1[0x1b]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[4] = alVar2;
  out[0x1b] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x1a],(undefined1  [32])bf1[5]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[5],(undefined1  [32])bf1[0x1a]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[5] = alVar2;
  out[0x1a] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x19],(undefined1  [32])bf1[6]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[6],(undefined1  [32])bf1[0x19]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[6] = alVar2;
  out[0x19] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x18],(undefined1  [32])bf1[7]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[7],(undefined1  [32])bf1[0x18]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[7] = alVar2;
  out[0x18] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x17],(undefined1  [32])bf1[8]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[8],(undefined1  [32])bf1[0x17]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[8] = alVar2;
  out[0x17] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x16],(undefined1  [32])bf1[9]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[9],(undefined1  [32])bf1[0x16]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[9] = alVar2;
  out[0x16] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x15],(undefined1  [32])bf1[10]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[10],(undefined1  [32])bf1[0x15]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[10] = alVar2;
  out[0x15] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x14],(undefined1  [32])bf1[0xb]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[0xb],(undefined1  [32])bf1[0x14]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[0xb] = alVar2;
  out[0x14] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x13],(undefined1  [32])bf1[0xc]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[0xc],(undefined1  [32])bf1[0x13]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[0xc] = alVar2;
  out[0x13] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x12],(undefined1  [32])bf1[0xd]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[0xd],(undefined1  [32])bf1[0x12]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[0xd] = alVar2;
  out[0x12] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x11],(undefined1  [32])bf1[0xe]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[0xe],(undefined1  [32])bf1[0x11]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[0xe] = alVar2;
  out[0x11] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x10],(undefined1  [32])bf1[0xf]);
  auVar4 = vpsubd_avx2((undefined1  [32])bf1[0xf],(undefined1  [32])bf1[0x10]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar2 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar4,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  out[0xf] = alVar2;
  out[0x10] = alVar3;
  if (do_cols == 0) {
    iVar5 = 10;
    if (10 < bd) {
      iVar5 = bd;
    }
    local_a0 = 0x20 << ((byte)iVar5 & 0x1f);
    local_80 = -local_a0;
    local_a0 = local_a0 + -1;
    iStack_9c = local_a0;
    iStack_98 = local_a0;
    iStack_94 = local_a0;
    iStack_90 = local_a0;
    iStack_8c = local_a0;
    iStack_88 = local_a0;
    iStack_84 = local_a0;
    iStack_7c = local_80;
    iStack_78 = local_80;
    iStack_74 = local_80;
    iStack_70 = local_80;
    iStack_6c = local_80;
    iStack_68 = local_80;
    iStack_64 = local_80;
    round_shift_8x8_avx2(out,out_shift);
    round_shift_8x8_avx2(out + 0x10,out_shift);
    highbd_clamp_epi32_avx2(out,out,(__m256i *)&local_80,(__m256i *)&local_a0,0x20);
  }
  return;
}

Assistant:

static inline void idct32_stage9_avx2(__m256i *bf1, __m256i *out,
                                      const int do_cols, const int bd,
                                      const int out_shift,
                                      const __m256i *clamp_lo,
                                      const __m256i *clamp_hi) {
  addsub_avx2(bf1[0], bf1[31], out + 0, out + 31, clamp_lo, clamp_hi);
  addsub_avx2(bf1[1], bf1[30], out + 1, out + 30, clamp_lo, clamp_hi);
  addsub_avx2(bf1[2], bf1[29], out + 2, out + 29, clamp_lo, clamp_hi);
  addsub_avx2(bf1[3], bf1[28], out + 3, out + 28, clamp_lo, clamp_hi);
  addsub_avx2(bf1[4], bf1[27], out + 4, out + 27, clamp_lo, clamp_hi);
  addsub_avx2(bf1[5], bf1[26], out + 5, out + 26, clamp_lo, clamp_hi);
  addsub_avx2(bf1[6], bf1[25], out + 6, out + 25, clamp_lo, clamp_hi);
  addsub_avx2(bf1[7], bf1[24], out + 7, out + 24, clamp_lo, clamp_hi);
  addsub_avx2(bf1[8], bf1[23], out + 8, out + 23, clamp_lo, clamp_hi);
  addsub_avx2(bf1[9], bf1[22], out + 9, out + 22, clamp_lo, clamp_hi);
  addsub_avx2(bf1[10], bf1[21], out + 10, out + 21, clamp_lo, clamp_hi);
  addsub_avx2(bf1[11], bf1[20], out + 11, out + 20, clamp_lo, clamp_hi);
  addsub_avx2(bf1[12], bf1[19], out + 12, out + 19, clamp_lo, clamp_hi);
  addsub_avx2(bf1[13], bf1[18], out + 13, out + 18, clamp_lo, clamp_hi);
  addsub_avx2(bf1[14], bf1[17], out + 14, out + 17, clamp_lo, clamp_hi);
  addsub_avx2(bf1[15], bf1[16], out + 15, out + 16, clamp_lo, clamp_hi);
  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m256i clamp_lo_out = _mm256_set1_epi32(-(1 << (log_range_out - 1)));
    const __m256i clamp_hi_out =
        _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);
    round_shift_8x8_avx2(out, out_shift);
    round_shift_8x8_avx2(out + 16, out_shift);
    highbd_clamp_epi32_avx2(out, out, &clamp_lo_out, &clamp_hi_out, 32);
  }
}